

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O0

size_t ZSTD_count(BYTE *pIn,BYTE *pMatch,BYTE *pInLimit)

{
  U16 UVar1;
  uint uVar2;
  U32 UVar3;
  U32 UVar4;
  size_t sVar5;
  size_t sVar6;
  char *in_RDX;
  char *in_RSI;
  char *in_RDI;
  size_t diff_1;
  size_t diff;
  BYTE *pInLoopLimit;
  BYTE *pStart;
  undefined4 in_stack_ffffffffffffffa8;
  undefined4 in_stack_ffffffffffffffac;
  char *local_18;
  char *local_10;
  
  local_18 = in_RSI;
  local_10 = in_RDI;
  if (in_RDI < in_RDX + -7) {
    sVar5 = MEM_readST(in_RSI);
    sVar6 = MEM_readST(in_RDI);
    if (sVar5 != sVar6) {
      uVar2 = ZSTD_NbCommonBytes(CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8));
      return (ulong)uVar2;
    }
    local_18 = in_RSI + 8;
    for (local_10 = in_RDI + 8; local_10 < in_RDX + -7; local_10 = local_10 + 8) {
      sVar5 = MEM_readST(local_18);
      sVar6 = MEM_readST(local_10);
      if (sVar5 != sVar6) {
        uVar2 = ZSTD_NbCommonBytes(CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8));
        return (size_t)(local_10 + ((ulong)uVar2 - (long)in_RDI));
      }
      local_18 = local_18 + 8;
    }
  }
  uVar2 = MEM_64bits();
  if ((uVar2 != 0) && (local_10 < in_RDX + -3)) {
    UVar3 = MEM_read32(local_18);
    UVar4 = MEM_read32(local_10);
    if (UVar3 == UVar4) {
      local_10 = local_10 + 4;
      local_18 = local_18 + 4;
    }
  }
  if (local_10 < in_RDX + -1) {
    UVar1 = MEM_read16(local_18);
    uVar2 = (uint)UVar1;
    UVar1 = MEM_read16(local_10);
    if (uVar2 == UVar1) {
      local_10 = local_10 + 2;
      local_18 = local_18 + 2;
    }
  }
  if ((local_10 < in_RDX) && (*local_18 == *local_10)) {
    local_10 = local_10 + 1;
  }
  return (size_t)(local_10 + -(long)in_RDI);
}

Assistant:

MEM_STATIC size_t ZSTD_count(const BYTE* pIn, const BYTE* pMatch, const BYTE* const pInLimit)
{
    const BYTE* const pStart = pIn;
    const BYTE* const pInLoopLimit = pInLimit - (sizeof(size_t)-1);

    if (pIn < pInLoopLimit) {
        { size_t const diff = MEM_readST(pMatch) ^ MEM_readST(pIn);
          if (diff) return ZSTD_NbCommonBytes(diff); }
        pIn+=sizeof(size_t); pMatch+=sizeof(size_t);
        while (pIn < pInLoopLimit) {
            size_t const diff = MEM_readST(pMatch) ^ MEM_readST(pIn);
            if (!diff) { pIn+=sizeof(size_t); pMatch+=sizeof(size_t); continue; }
            pIn += ZSTD_NbCommonBytes(diff);
            return (size_t)(pIn - pStart);
    }   }
    if (MEM_64bits() && (pIn<(pInLimit-3)) && (MEM_read32(pMatch) == MEM_read32(pIn))) { pIn+=4; pMatch+=4; }
    if ((pIn<(pInLimit-1)) && (MEM_read16(pMatch) == MEM_read16(pIn))) { pIn+=2; pMatch+=2; }
    if ((pIn<pInLimit) && (*pMatch == *pIn)) pIn++;
    return (size_t)(pIn - pStart);
}